

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O2

void __thiscall libDAI::NDP::NDP(NDP *this)

{
  undefined1 auVar1 [64];
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f908;
  (this->Props).verbose = 0;
  (this->_m_varOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_varOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->_m_varOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_newFacs =
       (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)auVar1._0_24_;
  this->_m_bestResps =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )auVar1._24_24_;
  (this->_m_neighV).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->_m_neighV).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_neighV).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar1;
  this->_k = 1;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->_k_th_Val = -1.79769313486232e+308;
  return;
}

Assistant:

NDP() : 
                DAIAlgFG(), 
                Props(), 
                //_maxdiff(0.0), 
                //_iterations(0UL), 
                //_indices(),
                //_messages(), 
                //_newmessages(), 
                _g(NULL),
                _k(1),
                _k_th_Val(-DBL_MAX) //,  
                //writeAnyTimeResults(false),  
                //results_f(NULL), 
                //timings_f(NULL)
            {}